

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall
mjs::regexp_literal_expression::regexp_literal_expression
          (regexp_literal_expression *this,source_extend *extend,wstring_view pattern,
          wstring_view flags)

{
  source_extend *extend_local;
  regexp_literal_expression *this_local;
  wstring_view flags_local;
  wstring_view pattern_local;
  
  expression::syntax_node(&this->super_expression,extend);
  (this->super_expression).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__regexp_literal_expression_0028e460;
  regexp::regexp(&this->re_,pattern,flags);
  return;
}

Assistant:

explicit regexp_literal_expression(const source_extend& extend, std::wstring_view pattern, std::wstring_view flags) : expression(extend), re_(pattern, flags) {
    }